

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

void __thiscall
xemmai::t_type_of<xemmai::t_object>::
f_override<xemmai::t_type_of<xemmai::t_type_of<xemmai::t_object>>,xemmai::t_type_of<xemmai::t_object>>
          (t_type_of<xemmai::t_object> *this)

{
  t_type_of<xemmai::t_object> *this_local;
  
  this->f_scan = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_scan;
  this->v_instantiate =
       (offset_in_t_type_to_subr)
       t_uninstantiatable<xemmai::t_bears<xemmai::t_type_of<xemmai::t_object>,_xemmai::t_type_of<xemmai::t_object>_>_>
       ::f_do_instantiate;
  *(undefined8 *)&this->field_0x88 = 0;
  this->f_call = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_call;
  this->f_add = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_add;
  return;
}

Assistant:

void f_override()
	{
		if (T::f_do_scan != U::f_do_scan) f_scan = T::f_do_scan;
		if (&T::f_do_construct != &U::f_do_construct) v_construct = static_cast<t_pvalue(t_type::*)(t_pvalue*, size_t)>(&T::f_do_construct);
		if (&T::f_do_instantiate != &U::f_do_instantiate) v_instantiate = static_cast<void(t_type::*)(t_pvalue*, size_t)>(&T::f_do_instantiate);
		if (T::f_do_call != U::f_do_call) f_call = T::f_do_call;
		if (T::f_do_string != U::f_do_string) f_string = T::f_do_string;
		if (T::f_do_hash != U::f_do_hash) f_hash = T::f_do_hash;
		if (T::f_do_get_at != U::f_do_get_at) f_get_at = T::f_do_get_at;
		if (T::f_do_set_at != U::f_do_set_at) f_set_at = T::f_do_set_at;
		if (T::f_do_plus != U::f_do_plus) f_plus = T::f_do_plus;
		if (T::f_do_minus != U::f_do_minus) f_minus = T::f_do_minus;
		if (T::f_do_complement != U::f_do_complement) f_complement = T::f_do_complement;
		if (T::f_do_multiply != U::f_do_multiply) f_multiply = T::f_do_multiply;
		if (T::f_do_divide != U::f_do_divide) f_divide = T::f_do_divide;
		if (T::f_do_modulus != U::f_do_modulus) f_modulus = T::f_do_modulus;
		if (T::f_do_add != U::f_do_add) f_add = T::f_do_add;
		if (T::f_do_subtract != U::f_do_subtract) f_subtract = T::f_do_subtract;
		if (T::f_do_left_shift != U::f_do_left_shift) f_left_shift = T::f_do_left_shift;
		if (T::f_do_right_shift != U::f_do_right_shift) f_right_shift = T::f_do_right_shift;
		if (T::f_do_less != U::f_do_less) f_less = T::f_do_less;
		if (T::f_do_less_equal != U::f_do_less_equal) f_less_equal = T::f_do_less_equal;
		if (T::f_do_greater != U::f_do_greater) f_greater = T::f_do_greater;
		if (T::f_do_greater_equal != U::f_do_greater_equal) f_greater_equal = T::f_do_greater_equal;
		if (T::f_do_equals != U::f_do_equals) f_equals = T::f_do_equals;
		if (T::f_do_not_equals != U::f_do_not_equals) f_not_equals = T::f_do_not_equals;
		if (T::f_do_and != U::f_do_and) f_and = T::f_do_and;
		if (T::f_do_xor != U::f_do_xor) f_xor = T::f_do_xor;
		if (T::f_do_or != U::f_do_or) f_or = T::f_do_or;
	}